

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::WaitSyncInvalidSyncTest::iterate(WaitSyncInvalidSyncTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  int iVar4;
  Library *pLVar5;
  MessageBuilder *this_00;
  TestError *this_01;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  pLVar5 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*pLVar5->_vptr_Library[0x3a])(pLVar5,(this->super_SyncTest).m_eglDisplay,0,0);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar3);
  std::operator<<((ostream *)poVar1," = eglWaitSyncKHR(");
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,&(this->super_SyncTest).m_eglDisplay);
  std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  ", EGL_NO_SYNC_KHR, 0)");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar4);
  std::operator<<((ostream *)poVar1," = eglGetError()");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (iVar4 == 0x300c) {
    if (iVar3 != 0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"status == EGL_FALSE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x480);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_02 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Unexpected error \'");
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"\' expected EGL_BAD_PARAMETER");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_02 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		EGLint status = egl.waitSyncKHR(m_eglDisplay, EGL_NO_SYNC_KHR, 0);
		log << TestLog::Message << status << " = eglWaitSyncKHR(" << m_eglDisplay << ", EGL_NO_SYNC_KHR, 0)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_PARAMETER)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_PARAMETER" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(status == EGL_FALSE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}